

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int WebRtcIsac_DecodeUb12
              (TransformTables *transform_tables,float *signal_out,ISACUBDecStruct *ISACdecUB_obj,
              int16_t isRCUPayload)

{
  int16_t iVar1;
  int n;
  int iVar2;
  long lVar3;
  double percepFilterParam [30];
  double imag_f [240];
  double real_f [240];
  float HP_dec_float [240];
  float LP_dec_float [240];
  double HPw [240];
  double LPw [240];
  double adStack_2698 [30];
  double local_25a8 [240];
  double local_1e28 [240];
  float local_16a8 [240];
  float local_12e8 [240];
  double local_f28 [240];
  double local_7a8 [240];
  
  iVar1 = WebRtcIsac_DecodeInterpolLpcUb(&ISACdecUB_obj->bitstr_obj,adStack_2698,0xc);
  if (iVar1 < 0) {
    iVar2 = (int)iVar1;
  }
  else {
    iVar2 = WebRtcIsac_DecodeSpec
                      (&ISACdecUB_obj->bitstr_obj,0,kIsacUpperBand12,local_1e28,local_25a8);
    if (-1 < iVar2) {
      if (isRCUPayload != 0) {
        lVar3 = 0;
        do {
          local_1e28[lVar3] = local_1e28[lVar3] + local_1e28[lVar3];
          local_25a8[lVar3] = local_25a8[lVar3] + local_25a8[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xf0);
      }
      WebRtcIsac_Spec2time
                (transform_tables,local_1e28,local_25a8,local_7a8,local_f28,
                 &ISACdecUB_obj->fftstr_obj);
      WebRtcIsac_NormLatticeFilterAr
                (4,(ISACdecUB_obj->maskfiltstr_obj).PostStateLoF,
                 (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG,local_7a8,adStack_2698,local_12e8);
      memset(local_16a8,0,0x3c0);
      WebRtcIsac_FilterAndCombineFloat
                (local_16a8,local_12e8,signal_out,&ISACdecUB_obj->postfiltbankstr_obj);
    }
  }
  return iVar2;
}

Assistant:

int WebRtcIsac_DecodeUb12(const TransformTables* transform_tables,
                          float* signal_out, ISACUBDecStruct* ISACdecUB_obj,
                          int16_t isRCUPayload) {
  int len, err;

  float LP_dec_float[FRAMESAMPLES_HALF];
  float HP_dec_float[FRAMESAMPLES_HALF];

  double LPw[FRAMESAMPLES_HALF];
  double HPw[FRAMESAMPLES_HALF];

  double percepFilterParam[(UB_LPC_ORDER + 1)*SUBFRAMES];

  double real_f[FRAMESAMPLES_HALF];
  double imag_f[FRAMESAMPLES_HALF];
  const int16_t kAveragePitchGain = 0; /* No pitch-gain for upper-band. */
  len = 0;

  /* Decode & dequantize filter coefficients. */
  err = WebRtcIsac_DecodeInterpolLpcUb(&ISACdecUB_obj->bitstr_obj,
                                       percepFilterParam, isac12kHz);
  if (err < 0) {
    return err;
  }

  /* Decode & de-quantize spectrum. */
  len = WebRtcIsac_DecodeSpec(&ISACdecUB_obj->bitstr_obj, kAveragePitchGain,
                              kIsacUpperBand12, real_f, imag_f);
  if (len < 0) {
    return len;
  }

  if (isRCUPayload) {
    int n;
    for (n = 0; n < 240; n++) {
      real_f[n] *= RCU_TRANSCODING_SCALE_UB_INVERSE;
      imag_f[n] *= RCU_TRANSCODING_SCALE_UB_INVERSE;
    }
  }
  /* Inverse transform. */
  WebRtcIsac_Spec2time(transform_tables,
                       real_f, imag_f, LPw, HPw, &ISACdecUB_obj->fftstr_obj);
  /* perceptual post-filtering (using normalized lattice filter) */
  WebRtcIsac_NormLatticeFilterAr(UB_LPC_ORDER,
                                 ISACdecUB_obj->maskfiltstr_obj.PostStateLoF,
                                 (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG,
                                 LPw, percepFilterParam, LP_dec_float);
  /* Zero for 12-16 kHz. */
  memset(HP_dec_float, 0, sizeof(float) * (FRAMESAMPLES_HALF));
  /* Recombine the 2 bands. */
  WebRtcIsac_FilterAndCombineFloat(HP_dec_float, LP_dec_float, signal_out,
                                   &ISACdecUB_obj->postfiltbankstr_obj);
  return len;
}